

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void destStore64Gray8(QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *buffer,int length)

{
  quint8 qVar1;
  bool bVar2;
  quint16 qVar3;
  quint16 qVar4;
  uint uVar5;
  uchar *puVar6;
  unsigned_short *dst;
  QColorTransformPrivate *count;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  QRasterBuffer *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int k_1;
  QColorTransformPrivate *tfd;
  int k;
  bool failed;
  uchar *data;
  QColorTransform tf;
  QColorSpace fromCS;
  quint16 gray_line [2048];
  QColorSpace *in_stack_ffffffffffffef78;
  QColorSpace *in_stack_ffffffffffffef80;
  uint in_stack_ffffffffffffefa0;
  NamedColorSpace in_stack_ffffffffffffefa4;
  QColorSpace *in_stack_ffffffffffffefa8;
  int iVar7;
  uint in_stack_ffffffffffffefb4;
  undefined4 in_stack_ffffffffffffefc0;
  QFlagsStorage<QColorTransformPrivate::TransformFlag> flags;
  QFlags<QColorTransformPrivate::TransformFlag> local_1008 [1024];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar6 = QRasterBuffer::scanLine(in_RDI,in_EDX);
  dst = (unsigned_short *)(puVar6 + in_ESI);
  in_stack_ffffffffffffefb4 = in_stack_ffffffffffffefb4 & 0xffffff;
  iVar7 = 0;
  do {
    flags.i = (Int)((ulong)in_RDI >> 0x20);
    if (in_R8D <= iVar7) {
LAB_00b715a7:
      if ((in_stack_ffffffffffffefb4 & 0x1000000) != 0) {
        bVar2 = QColorSpace::isValid(in_stack_ffffffffffffef78);
        if (bVar2) {
          QColorSpace::QColorSpace(in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
        }
        else {
          QColorSpace::QColorSpace(in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4);
        }
        QColorSpacePrivate::get((QColorSpace *)0xb7160c);
        QColorSpacePrivate::transformationToXYZ
                  ((QColorSpacePrivate *)
                   CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
        count = QColorTransformPrivate::get((QColorTransform *)0xb71623);
        QFlags<QColorTransformPrivate::TransformFlag>::QFlags
                  (local_1008,(TransformFlag)((ulong)count >> 0x20));
        QColorTransformPrivate::apply<unsigned_short,QRgba64>
                  ((QColorTransformPrivate *)CONCAT44(in_R8D,in_stack_ffffffffffffefc0),dst,
                   (QRgba64 *)CONCAT44(in_stack_ffffffffffffefb4,iVar7),(qsizetype)count,
                   (TransformFlags)flags.i);
        for (iVar7 = 0; iVar7 < in_R8D; iVar7 = iVar7 + 1) {
          uVar5 = qt_div_257(0);
          *(char *)((long)dst + (long)iVar7) = (char)uVar5;
        }
        QColorTransform::~QColorTransform((QColorTransform *)0xb716c8);
        QColorSpace::~QColorSpace((QColorSpace *)0xb716d2);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    qVar3 = QRgba64::red((QRgba64 *)(in_RCX + (long)iVar7 * 8));
    in_stack_ffffffffffffefa0 = (uint)qVar3;
    qVar3 = QRgba64::green((QRgba64 *)(in_RCX + (long)iVar7 * 8));
    flags.i = (Int)((ulong)in_RDI >> 0x20);
    if (in_stack_ffffffffffffefa0 != qVar3) {
LAB_00b7156b:
      in_stack_ffffffffffffefb4 = CONCAT13(1,(int3)in_stack_ffffffffffffefb4);
      goto LAB_00b715a7;
    }
    qVar3 = QRgba64::red((QRgba64 *)(in_RCX + (long)iVar7 * 8));
    qVar4 = QRgba64::blue((QRgba64 *)(in_RCX + (long)iVar7 * 8));
    flags.i = (Int)((ulong)in_RDI >> 0x20);
    if (qVar3 != qVar4) goto LAB_00b7156b;
    qVar1 = QRgba64::red8((QRgba64 *)in_stack_ffffffffffffef78);
    *(quint8 *)((long)dst + (long)iVar7) = qVar1;
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

static void QT_FASTCALL destStore64Gray8(QRasterBuffer *rasterBuffer, int x, int y, const QRgba64 *buffer, int length)
{
    uchar *data = rasterBuffer->scanLine(y) + x;

    bool failed = false;
    for (int k = 0; k < length; ++k) {
        if (buffer[k].red() != buffer[k].green() || buffer[k].red() != buffer[k].blue()) {
            failed = true;
            break;
        }
        data[k] = buffer[k].red8();
    }
    if (failed) { // Non-gray colors
        QColorSpace fromCS = rasterBuffer->colorSpace.isValid() ? rasterBuffer->colorSpace : QColorSpace::SRgb;
        QColorTransform tf = QColorSpacePrivate::get(fromCS)->transformationToXYZ();
        QColorTransformPrivate *tfd = QColorTransformPrivate::get(tf);

        Q_DECL_UNINITIALIZED quint16 gray_line[BufferSize];
        tfd->apply(gray_line, buffer, length, QColorTransformPrivate::InputPremultiplied);
        for (int k = 0; k < length; ++k)
            data[k] = qt_div_257(gray_line[k]);
    }
}